

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

void __thiscall Polynomial::Polynomial(Polynomial *this,int numstates,int numvars)

{
  value_type_conflict2 local_34;
  int local_30;
  int i_1;
  value_type_conflict2 local_1c;
  int local_18;
  int i;
  int numvars_local;
  int numstates_local;
  Polynomial *this_local;
  
  this->mNumStates = numstates;
  this->mNumVariables = numvars;
  this->mFirstOperation = numstates + numvars;
  this->mResultLocation = 0;
  local_18 = numvars;
  i = numstates;
  _numvars_local = this;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::vector
            ((vector<Polynomial::operand,_std::allocator<Polynomial::operand>_> *)&this->mOperands);
  for (local_1c = 0; local_1c < this->mNumStates; local_1c = local_1c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,&local_1c);
  }
  for (local_30 = 0; local_30 < this->mNumVariables; local_30 = local_30 + 1) {
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,&local_34);
  }
  return;
}

Assistant:

Polynomial::Polynomial(int numstates, int numvars)
  : mNumStates(numstates),
    mNumVariables(numvars),
    mFirstOperation(numstates + numvars),
    mResultLocation(0)
{
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues.push_back(i);
  for (int i=0; i < mNumVariables; ++i)
    mEvaluationValues.push_back(0);
}